

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRSDA.cpp
# Opt level: O2

void __thiscall chrono::ChLinkRSDA::ArchiveOUT(ChLinkRSDA *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChCoordsys<double>_> local_48;
  ChNameValue<chrono::ChCoordsys<double>_> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkRSDA>(marchive);
  ChLink::ArchiveOUT(&this->super_ChLink,marchive);
  local_30._value = &this->m_csys1;
  local_30._name = "m_csys1";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->m_csys2;
  local_48._name = "m_csys2";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  return;
}

Assistant:

void ChLinkRSDA::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkRSDA>();

    // serialize parent class
    ChLink::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(m_csys1);
    marchive << CHNVP(m_csys2);
}